

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O2

int chacha_test(uint8_t *input_buffer)

{
  uint8_t *in;
  uint8_t *out_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  chacha_iv iv;
  chacha_key key;
  uint8_t h_iv [16];
  uint8_t h_key [32];
  uint8_t final_hchacha [32];
  uint8_t out [2056];
  
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
    key.b[lVar5] = (char)lVar5 + ' ';
  }
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    iv.b[lVar5] = (char)lVar5 + 0x80;
  }
  in = input_buffer + 1;
  out_00 = out + 1;
  uVar1 = chacha_test_oneblock(&key,&iv,input_buffer,out);
  uVar2 = chacha_test_oneblock(&key,&iv,input_buffer,out_00);
  uVar2 = uVar2 & uVar1;
  if (input_buffer != (uint8_t *)0x0) {
    uVar1 = chacha_test_oneblock(&key,&iv,in,out);
    uVar3 = chacha_test_oneblock(&key,&iv,in,out_00);
    uVar2 = uVar2 & uVar3 & uVar1;
  }
  uVar1 = chacha_test_multiblock(&key,&iv,input_buffer,out);
  uVar3 = chacha_test_multiblock(&key,&iv,input_buffer,out_00);
  uVar2 = uVar3 & uVar1 & uVar2;
  if (input_buffer != (uint8_t *)0x0) {
    uVar1 = chacha_test_multiblock(&key,&iv,in,out);
    uVar3 = chacha_test_multiblock(&key,&iv,in,out_00);
    uVar2 = uVar2 & uVar3 & uVar1;
  }
  uVar1 = chacha_test_multiblock_incremental(&key,&iv,input_buffer,out);
  uVar3 = chacha_test_multiblock_incremental(&key,&iv,input_buffer,out_00);
  uVar2 = uVar3 & uVar1 & uVar2;
  if (input_buffer != (uint8_t *)0x0) {
    uVar1 = chacha_test_multiblock_incremental(&key,&iv,in,out);
    uVar3 = chacha_test_multiblock_incremental(&key,&iv,in,out_00);
    uVar2 = uVar2 & uVar3 & uVar1;
  }
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
    h_key[lVar5] = (char)lVar5 + 0xc0;
  }
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    h_iv[lVar5] = (char)lVar5 + '\x10';
  }
  final_hchacha[0x10] = '\0';
  final_hchacha[0x11] = '\0';
  final_hchacha[0x12] = '\0';
  final_hchacha[0x13] = '\0';
  final_hchacha[0x14] = '\0';
  final_hchacha[0x15] = '\0';
  final_hchacha[0x16] = '\0';
  final_hchacha[0x17] = '\0';
  final_hchacha[0x18] = '\0';
  final_hchacha[0x19] = '\0';
  final_hchacha[0x1a] = '\0';
  final_hchacha[0x1b] = '\0';
  final_hchacha[0x1c] = '\0';
  final_hchacha[0x1d] = '\0';
  final_hchacha[0x1e] = '\0';
  final_hchacha[0x1f] = '\0';
  final_hchacha[0] = '\0';
  final_hchacha[1] = '\0';
  final_hchacha[2] = '\0';
  final_hchacha[3] = '\0';
  final_hchacha[4] = '\0';
  final_hchacha[5] = '\0';
  final_hchacha[6] = '\0';
  final_hchacha[7] = '\0';
  final_hchacha[8] = '\0';
  final_hchacha[9] = '\0';
  final_hchacha[10] = '\0';
  final_hchacha[0xb] = '\0';
  final_hchacha[0xc] = '\0';
  final_hchacha[0xd] = '\0';
  final_hchacha[0xe] = '\0';
  final_hchacha[0xf] = '\0';
  hchacha_ref(h_key,h_iv,final_hchacha,8);
  iVar4 = bcmp(expected_hchacha,final_hchacha,0x20);
  return iVar4 == 0 & uVar2;
}

Assistant:

static int
chacha_test(const uint8_t *input_buffer) {
    chacha_key key;
    chacha_iv iv;
    uint8_t h_key[32];
    uint8_t h_iv[16];
    uint8_t out[CHACHA_TEST_LEN+sizeof(size_t)], final_hchacha[32];
    const uint8_t *in_aligned, *in_unaligned;
    uint8_t *out_aligned, *out_unaligned;
    size_t i;
    int res = 1;

    /*
        key [32,33,34,..63], iv [128,129,130,131,132,133,134,135]
    */
    for (i = 0; i < sizeof(key); i++) key.b[i] = (uint8_t)(i + 32);
    for (i = 0; i < sizeof(iv); i++) iv.b[i] = (uint8_t)(i + 128);

    in_aligned = input_buffer;
    in_unaligned = (input_buffer) ? (input_buffer + 1) : NULL;
    out_aligned = out;
    out_unaligned = out + 1;

    /* single block */
    res &= chacha_test_oneblock(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_oneblock(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_oneblock(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_oneblock(&key, &iv, in_unaligned, out_unaligned);
    }

    /* multi */
    res &= chacha_test_multiblock(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_multiblock(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_multiblock(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_multiblock(&key, &iv, in_unaligned, out_unaligned);
    }

    /* incremental */
    res &= chacha_test_multiblock_incremental(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_multiblock_incremental(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_multiblock_incremental(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_multiblock_incremental(&key, &iv, in_unaligned, out_unaligned);
    }

    /*
        hchacha
        key [192,193,194,..223], iv [16,17,18,..31]
    */
    for (i = 0; i < sizeof(h_key); i++) h_key[i] = (uint8_t)(i + 192);
    for (i = 0; i < sizeof(h_iv); i++) h_iv[i] = (uint8_t)(i + 16);

    memset(final_hchacha, 0, sizeof(final_hchacha));
    hchacha(h_key, h_iv, final_hchacha, chacha_test_rounds);
    res &= (memcmp(expected_hchacha, final_hchacha, sizeof(expected_hchacha)) == 0) ? 1 : 0;

    return res;
}